

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMParentNode::DOMParentNode
          (DOMParentNode *this,DOMNode *containingNode,DOMDocument *ownerDoc)

{
  DOMException *this_00;
  DOMNode *pDVar1;
  
  this->_vptr_DOMParentNode = (_func_int **)&PTR_appendChildFast_003fe898;
  this->fContainingNode = containingNode;
  this->fOwnerDocument = ownerDoc;
  this->fFirstChild = (DOMNode *)0x0;
  DOMNodeListImpl::DOMNodeListImpl(&this->fChildNodeList,this);
  if (this->fContainingNode != (DOMNode *)0x0) {
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fOwnerDocument == (DOMDocument *)0x0) {
    pDVar1 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = &this->fOwnerDocument[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar1->_vptr_DOMNode);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMParentNode::DOMParentNode(DOMNode* containingNode, DOMDocument *ownerDoc)
    : fContainingNode(containingNode), fOwnerDocument(ownerDoc), fFirstChild(0), fChildNodeList(this)
{
    if (!fContainingNode) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeMemoryManager);
    }
}